

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_env.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  exception *e;
  string local_1040 [32];
  ostringstream local_1020 [8];
  ostringstream ss_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ea8;
  undefined1 local_e81;
  string local_e80 [32];
  ostringstream local_e60 [8];
  ostringstream ss_7;
  string local_ce0 [32];
  ostringstream local_cc0 [8];
  ostringstream ss_6;
  string local_b40 [32];
  ostringstream local_b20 [8];
  ostringstream ss_5;
  string local_9a0 [32];
  ostringstream local_980 [8];
  ostringstream ss_4;
  string local_800 [32];
  ostringstream local_7e0 [8];
  ostringstream ss_3;
  string local_660 [32];
  ostringstream local_640 [8];
  ostringstream ss_2;
  string local_4c0 [32];
  ostringstream local_4a0 [8];
  ostringstream ss_1;
  string local_320 [32];
  ostringstream local_300 [8];
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  char acStack_148 [8];
  char penv [256];
  allocator<char> local_31;
  undefined1 local_30 [8];
  string example;
  
  example.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,anon_var_dwarf_220a,&local_31);
  std::allocator<char>::~allocator(&local_31);
  penv[0xe8] = '\0';
  penv[0xe9] = '\0';
  penv[0xea] = '\0';
  penv[0xeb] = '\0';
  penv[0xec] = '\0';
  penv[0xed] = '\0';
  penv[0xee] = '\0';
  penv[0xef] = '\0';
  penv[0xf0] = '\0';
  penv[0xf1] = '\0';
  penv[0xf2] = '\0';
  penv[0xf3] = '\0';
  penv[0xf4] = '\0';
  penv[0xf5] = '\0';
  penv[0xf6] = '\0';
  penv[0xf7] = '\0';
  penv[0xd8] = '\0';
  penv[0xd9] = '\0';
  penv[0xda] = '\0';
  penv[0xdb] = '\0';
  penv[0xdc] = '\0';
  penv[0xdd] = '\0';
  penv[0xde] = '\0';
  penv[0xdf] = '\0';
  penv[0xe0] = '\0';
  penv[0xe1] = '\0';
  penv[0xe2] = '\0';
  penv[0xe3] = '\0';
  penv[0xe4] = '\0';
  penv[0xe5] = '\0';
  penv[0xe6] = '\0';
  penv[0xe7] = '\0';
  penv[200] = '\0';
  penv[0xc9] = '\0';
  penv[0xca] = '\0';
  penv[0xcb] = '\0';
  penv[0xcc] = '\0';
  penv[0xcd] = '\0';
  penv[0xce] = '\0';
  penv[0xcf] = '\0';
  penv[0xd0] = '\0';
  penv[0xd1] = '\0';
  penv[0xd2] = '\0';
  penv[0xd3] = '\0';
  penv[0xd4] = '\0';
  penv[0xd5] = '\0';
  penv[0xd6] = '\0';
  penv[0xd7] = '\0';
  penv[0xb8] = '\0';
  penv[0xb9] = '\0';
  penv[0xba] = '\0';
  penv[0xbb] = '\0';
  penv[0xbc] = '\0';
  penv[0xbd] = '\0';
  penv[0xbe] = '\0';
  penv[0xbf] = '\0';
  penv[0xc0] = '\0';
  penv[0xc1] = '\0';
  penv[0xc2] = '\0';
  penv[0xc3] = '\0';
  penv[0xc4] = '\0';
  penv[0xc5] = '\0';
  penv[0xc6] = '\0';
  penv[199] = '\0';
  penv[0xa8] = '\0';
  penv[0xa9] = '\0';
  penv[0xaa] = '\0';
  penv[0xab] = '\0';
  penv[0xac] = '\0';
  penv[0xad] = '\0';
  penv[0xae] = '\0';
  penv[0xaf] = '\0';
  penv[0xb0] = '\0';
  penv[0xb1] = '\0';
  penv[0xb2] = '\0';
  penv[0xb3] = '\0';
  penv[0xb4] = '\0';
  penv[0xb5] = '\0';
  penv[0xb6] = '\0';
  penv[0xb7] = '\0';
  penv[0x98] = '\0';
  penv[0x99] = '\0';
  penv[0x9a] = '\0';
  penv[0x9b] = '\0';
  penv[0x9c] = '\0';
  penv[0x9d] = '\0';
  penv[0x9e] = '\0';
  penv[0x9f] = '\0';
  penv[0xa0] = '\0';
  penv[0xa1] = '\0';
  penv[0xa2] = '\0';
  penv[0xa3] = '\0';
  penv[0xa4] = '\0';
  penv[0xa5] = '\0';
  penv[0xa6] = '\0';
  penv[0xa7] = '\0';
  penv[0x88] = '\0';
  penv[0x89] = '\0';
  penv[0x8a] = '\0';
  penv[0x8b] = '\0';
  penv[0x8c] = '\0';
  penv[0x8d] = '\0';
  penv[0x8e] = '\0';
  penv[0x8f] = '\0';
  penv[0x90] = '\0';
  penv[0x91] = '\0';
  penv[0x92] = '\0';
  penv[0x93] = '\0';
  penv[0x94] = '\0';
  penv[0x95] = '\0';
  penv[0x96] = '\0';
  penv[0x97] = '\0';
  penv[0x78] = '\0';
  penv[0x79] = '\0';
  penv[0x7a] = '\0';
  penv[0x7b] = '\0';
  penv[0x7c] = '\0';
  penv[0x7d] = '\0';
  penv[0x7e] = '\0';
  penv[0x7f] = '\0';
  penv[0x80] = '\0';
  penv[0x81] = '\0';
  penv[0x82] = '\0';
  penv[0x83] = '\0';
  penv[0x84] = '\0';
  penv[0x85] = '\0';
  penv[0x86] = '\0';
  penv[0x87] = '\0';
  penv[0x68] = '\0';
  penv[0x69] = '\0';
  penv[0x6a] = '\0';
  penv[0x6b] = '\0';
  penv[0x6c] = '\0';
  penv[0x6d] = '\0';
  penv[0x6e] = '\0';
  penv[0x6f] = '\0';
  penv[0x70] = '\0';
  penv[0x71] = '\0';
  penv[0x72] = '\0';
  penv[0x73] = '\0';
  penv[0x74] = '\0';
  penv[0x75] = '\0';
  penv[0x76] = '\0';
  penv[0x77] = '\0';
  penv[0x58] = '\0';
  penv[0x59] = '\0';
  penv[0x5a] = '\0';
  penv[0x5b] = '\0';
  penv[0x5c] = '\0';
  penv[0x5d] = '\0';
  penv[0x5e] = '\0';
  penv[0x5f] = '\0';
  penv[0x60] = '\0';
  penv[0x61] = '\0';
  penv[0x62] = '\0';
  penv[99] = '\0';
  penv[100] = '\0';
  penv[0x65] = '\0';
  penv[0x66] = '\0';
  penv[0x67] = '\0';
  penv[0x48] = '\0';
  penv[0x49] = '\0';
  penv[0x4a] = '\0';
  penv[0x4b] = '\0';
  penv[0x4c] = '\0';
  penv[0x4d] = '\0';
  penv[0x4e] = '\0';
  penv[0x4f] = '\0';
  penv[0x50] = '\0';
  penv[0x51] = '\0';
  penv[0x52] = '\0';
  penv[0x53] = '\0';
  penv[0x54] = '\0';
  penv[0x55] = '\0';
  penv[0x56] = '\0';
  penv[0x57] = '\0';
  penv[0x38] = '\0';
  penv[0x39] = '\0';
  penv[0x3a] = '\0';
  penv[0x3b] = '\0';
  penv[0x3c] = '\0';
  penv[0x3d] = '\0';
  penv[0x3e] = '\0';
  penv[0x3f] = '\0';
  penv[0x40] = '\0';
  penv[0x41] = '\0';
  penv[0x42] = '\0';
  penv[0x43] = '\0';
  penv[0x44] = '\0';
  penv[0x45] = '\0';
  penv[0x46] = '\0';
  penv[0x47] = '\0';
  penv[0x28] = '\0';
  penv[0x29] = '\0';
  penv[0x2a] = '\0';
  penv[0x2b] = '\0';
  penv[0x2c] = '\0';
  penv[0x2d] = '\0';
  penv[0x2e] = '\0';
  penv[0x2f] = '\0';
  penv[0x30] = '\0';
  penv[0x31] = '\0';
  penv[0x32] = '\0';
  penv[0x33] = '\0';
  penv[0x34] = '\0';
  penv[0x35] = '\0';
  penv[0x36] = '\0';
  penv[0x37] = '\0';
  penv[0x18] = '\0';
  penv[0x19] = '\0';
  penv[0x1a] = '\0';
  penv[0x1b] = '\0';
  penv[0x1c] = '\0';
  penv[0x1d] = '\0';
  penv[0x1e] = '\0';
  penv[0x1f] = '\0';
  penv[0x20] = '\0';
  penv[0x21] = '\0';
  penv[0x22] = '\0';
  penv[0x23] = '\0';
  penv[0x24] = '\0';
  penv[0x25] = '\0';
  penv[0x26] = '\0';
  penv[0x27] = '\0';
  penv[8] = '\0';
  penv[9] = '\0';
  penv[10] = '\0';
  penv[0xb] = '\0';
  penv[0xc] = '\0';
  penv[0xd] = '\0';
  penv[0xe] = '\0';
  penv[0xf] = '\0';
  penv[0x10] = '\0';
  penv[0x11] = '\0';
  penv[0x12] = '\0';
  penv[0x13] = '\0';
  penv[0x14] = '\0';
  penv[0x15] = '\0';
  penv[0x16] = '\0';
  penv[0x17] = '\0';
  acStack_148[0] = '\0';
  acStack_148[1] = '\0';
  acStack_148[2] = '\0';
  acStack_148[3] = '\0';
  acStack_148[4] = '\0';
  acStack_148[5] = '\0';
  acStack_148[6] = '\0';
  acStack_148[7] = '\0';
  penv[0] = '\0';
  penv[1] = '\0';
  penv[2] = '\0';
  penv[3] = '\0';
  penv[4] = '\0';
  penv[5] = '\0';
  penv[6] = '\0';
  penv[7] = '\0';
  std::operator+(&local_188,"NOWIDE_TEST2=",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::operator+(&local_168,&local_188,"x");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  strncpy(acStack_148,pcVar3,0xff);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = setenv("NOWIDE_TEST1",pcVar3,1);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_300);
    poVar4 = std::operator<<((ostream *)local_300,
                             "Error nowide::setenv(\"NOWIDE_TEST1\",example.c_str(),1)==0 in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_env.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1e);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_320);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = getenv("NOWIDE_TEST1");
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_4a0);
    poVar4 = std::operator<<((ostream *)local_4a0,"Error nowide::getenv(\"NOWIDE_TEST1\") in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_env.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1f);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_4c0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = getenv("NOWIDE_TEST1");
  bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_30);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_640);
    poVar4 = std::operator<<((ostream *)local_640,
                             "Error nowide::getenv(\"NOWIDE_TEST1\")==example in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_env.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x20);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_660);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = setenv("NOWIDE_TEST1","xx",0);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_7e0);
    poVar4 = std::operator<<((ostream *)local_7e0,
                             "Error nowide::setenv(\"NOWIDE_TEST1\",\"xx\",0)==0 in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_env.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x21);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_800);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = getenv("NOWIDE_TEST1");
  bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_30);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_980);
    poVar4 = std::operator<<((ostream *)local_980,
                             "Error nowide::getenv(\"NOWIDE_TEST1\")==example in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_env.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x22);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_9a0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = putenv(acStack_148);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_b20);
    poVar4 = std::operator<<((ostream *)local_b20,"Error nowide::putenv(penv)==0 in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_env.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x23);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_b40);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = getenv("NOWIDE_TEST2");
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_cc0);
    poVar4 = std::operator<<((ostream *)local_cc0,"Error nowide::getenv(\"NOWIDE_TEST2\") in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_env.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x24);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_ce0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = getenv("NOWIDE_TEST_INVALID");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = getenv("NOWIDE_TEST2");
    std::operator+(&local_ea8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,"x"
                  );
    bVar1 = std::operator==(pcVar3,&local_ea8);
    std::__cxx11::string::~string((string *)&local_ea8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_1020);
      poVar4 = std::operator<<((ostream *)local_1020,
                               "Error nowide::getenv(\"NOWIDE_TEST2\")==example + \"x\" in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_env.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x26);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_1040);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Ok");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    example.field_2._12_4_ = 0;
    std::__cxx11::string::~string((string *)local_30);
    return example.field_2._12_4_;
  }
  std::__cxx11::ostringstream::ostringstream(local_e60);
  poVar4 = std::operator<<((ostream *)local_e60,
                           "Error nowide::getenv(\"NOWIDE_TEST_INVALID\")==0 in ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_env.cpp"
                          );
  poVar4 = std::operator<<(poVar4,':');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x25);
  poVar4 = std::operator<<(poVar4," ");
  std::operator<<(poVar4,"main");
  local_e81 = 1;
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar5,local_e80);
  local_e81 = 0;
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
    try {
        std::string example = "\xd7\xa9-\xd0\xbc-\xce\xbd";
        char penv[256] = {0};
        strncpy(penv,("NOWIDE_TEST2=" + example + "x").c_str(),sizeof(penv)-1);
        
        TEST(nowide::setenv("NOWIDE_TEST1",example.c_str(),1)==0);
        TEST(nowide::getenv("NOWIDE_TEST1"));
        TEST(nowide::getenv("NOWIDE_TEST1")==example);
        TEST(nowide::setenv("NOWIDE_TEST1","xx",0)==0);
        TEST(nowide::getenv("NOWIDE_TEST1")==example);
        TEST(nowide::putenv(penv)==0);
        TEST(nowide::getenv("NOWIDE_TEST2"));
        TEST(nowide::getenv("NOWIDE_TEST_INVALID")==0);
        TEST(nowide::getenv("NOWIDE_TEST2")==example + "x");
        
        std::cout << "Ok" << std::endl;
        return 0;
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return 1;
    }
}